

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_lexer.cpp
# Opt level: O2

bool __thiscall Lexer::parseStringLiteral(Lexer *this,bool raw_string,int open_char)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  iterator iVar5;
  undefined2 uVar6;
  char *error;
  bool bVar7;
  int iVar8;
  string hex;
  string tok;
  
  tok._M_dataplus._M_p = (pointer)&tok.field_2;
  tok._M_string_length = 0;
  tok.field_2._M_local_buf[0] = '\0';
  this->insideString = true;
  iVar1 = this->curLine;
  iVar2 = this->curColumn;
  uVar3 = nextChar(this);
  while( true ) {
    if ((uVar3 == 0) || (this->ctx->isError != false)) goto LAB_0010a5df;
    if (uVar3 == open_char) break;
    if ((char)uVar3 == '\n') {
LAB_0010a438:
      if (!raw_string) {
        CompilationContext::error
                  (this->ctx,0x65,"end of line inside string literal",this->curLine,this->curColumn)
        ;
        this->insideString = false;
        goto LAB_0010a6af;
      }
      if ((uVar3 == 0xd) && (iVar4 = fetchChar(this,0), iVar4 == 10)) {
        nextChar(this);
      }
    }
    else if ((uVar3 & 0xff) == 0x5c) {
      if (!raw_string) {
        iVar4 = nextChar(this);
        switch(iVar4) {
        case 0x6e:
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x77:
switchD_0010a4ec_caseD_6f:
          error = "unrecognised escaper char";
          iVar1 = 0x67;
          goto LAB_0010a69e;
        case 0x72:
          break;
        case 0x74:
          break;
        case 0x75:
        case 0x78:
switchD_0010a4ec_caseD_75:
          iVar8 = 0x7fffffff;
          if (iVar4 == 0x75) {
            iVar8 = 4;
          }
          if (iVar4 == 0x55) {
            iVar8 = 8;
          }
          hex._M_dataplus._M_p = (pointer)&hex.field_2;
          hex._M_string_length = 0;
          hex.field_2._M_allocated_capacity = hex.field_2._M_allocated_capacity & 0xffffffffffffff00
          ;
          iVar8 = iVar8 + 1;
          do {
            iVar4 = fetchChar(this,0);
            if ((iVar4 == 0) || (iVar4 = isxdigit(iVar4), iVar4 == 0)) break;
            std::__cxx11::string::push_back((char)&hex);
            nextChar(this);
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
          if (hex._M_string_length == 0) {
            CompilationContext::error
                      (this->ctx,0x66,"hexadecimal number expected",this->curLine,this->curColumn);
          }
          else {
            strtoull(hex._M_dataplus._M_p,(char **)0x0,0x10);
          }
          std::__cxx11::string::~string((string *)&hex);
          break;
        case 0x76:
          break;
        default:
          if (((iVar4 != 0x22) && (iVar4 != 0x27)) && (iVar4 != 0x30)) {
            if (iVar4 == 0x55) goto switchD_0010a4ec_caseD_75;
            if (((iVar4 != 0x5c) && (iVar4 != 0x66)) && ((iVar4 != 0x62 && (iVar4 != 0x61))))
            goto switchD_0010a4ec_caseD_6f;
          }
        }
      }
    }
    else if ((uVar3 & 0xff) == 0xd) goto LAB_0010a438;
LAB_0010a40b:
    std::__cxx11::string::push_back((char)&tok);
    uVar3 = nextChar(this);
  }
  if ((raw_string) && (iVar4 = fetchChar(this,0), iVar4 == 0x22)) {
    nextChar(this);
    goto LAB_0010a40b;
  }
  this->insideString = false;
LAB_0010a5df:
  uVar6 = (undefined2)iVar2;
  if (open_char == 0x27) {
    if (tok._M_string_length == 0) {
      error = "empty constant";
      iVar1 = 0x68;
    }
    else {
      if (tok._M_string_length == 1) {
        hex.field_2._M_allocated_capacity = (size_type)(byte)*tok._M_dataplus._M_p;
        hex._M_dataplus._M_p._6_2_ = uVar6;
        hex._M_dataplus._M_p._0_6_ = 4;
        hex._M_string_length = CONCAT44(hex._M_string_length._4_4_,iVar1);
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(&this->tokens,(Token *)&hex)
        ;
        goto LAB_0010a686;
      }
      error = "constant is too long";
      iVar1 = 0x69;
    }
LAB_0010a69e:
    CompilationContext::error(this->ctx,iVar1,error,this->curLine,this->curColumn);
LAB_0010a6af:
    bVar7 = false;
  }
  else {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->ctx->stringList,&tok);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->ctx->stringList)._M_t,&tok);
    hex.field_2._M_allocated_capacity = *(undefined8 *)(iVar5._M_node + 1);
    hex._M_dataplus._M_p._6_2_ = uVar6;
    hex._M_dataplus._M_p._0_6_ = 3;
    hex._M_string_length = CONCAT44(hex._M_string_length._4_4_,iVar1);
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(&this->tokens,(Token *)&hex);
LAB_0010a686:
    bVar7 = true;
  }
  std::__cxx11::string::~string((string *)&tok);
  return bVar7;
}

Assistant:

bool Lexer::parseStringLiteral(bool raw_string, int open_char)
{
  std::string tok;
  insideString = true;
  int beginColumn = curColumn;
  int beginLine = curLine;
  int ch = 0;

  for (ch = nextChar(); ch > 0 && !ctx.isError; ch = nextChar())
  {
    if (ch == open_char)
    {
      if (raw_string && fetchChar() == '\"')
      {
        ch = nextChar();
      }
      else
      {
        insideString = false;
        break;
      }
    }
    else if (ch == 0x0d || ch == 0x0a)
    {
      if (!raw_string)
      {
        ctx.error(101, "end of line inside string literal", curLine, curColumn);
        insideString = false;
        return false;
      }

      if (ch == 0x0d && fetchChar() == 0x0a)
      {
        nextChar();
        ch = '\n';
      }
    }
    else if (ch == '\\' && !raw_string)
    {
      ch = nextChar();
      switch (ch)
      {
      case '\\': ch = '\\'; break;
      case 'a': ch = '\a'; break;
      case 'b': ch = '\b'; break;
      case 'n': ch = '\n'; break;
      case 'r': ch = '\r'; break;
      case 'v': ch = '\v'; break;
      case 't': ch = '\t'; break;
      case 'f': ch = '\f'; break;
      case '0': ch = '\0'; break;
      case '\"': ch = '\"'; break;
      case '\'': ch = '\''; break;
      case 'x':
      case 'u':
      case 'U':
      {
        int digitsLimit = INT_MAX;
        if (ch == 'u')
          digitsLimit = 4;
        if (ch == 'U')
          digitsLimit = 8;

        std::string hex;

        for (ch = fetchChar(); ch > 0; ch = fetchChar())
        {
          if (!isxdigit(ch))
            break;
          hex += char(ch);
          nextChar();

          digitsLimit--;
          if (digitsLimit <= 0)
            break;
        }

        if (hex.empty())
        {
          ctx.error(102, "hexadecimal number expected", curLine, curColumn);
          break;
        }

        ch = (int)strtoull(hex.c_str(), nullptr, 16);
      }
      break;

      default:
        ctx.error(103, "unrecognised escaper char", curLine, curColumn);
        return false;
      }
    }

    tok += char(ch);
  }

  if (open_char == '\'')
  {
    if (tok.empty())
    {
      ctx.error(104, "empty constant", curLine, curColumn);
      return false;
    }

    if (tok.length() > 1)
    {
      ctx.error(105, "constant is too long", curLine, curColumn);
      return false;
    }

    Token::U u;
    u.i = (unsigned char)tok[0];
    tokens.push_back({ (TokenType)TK_INTEGER, false, false, (unsigned short)beginColumn, beginLine, u });
  }
  else
  {
    ctx.stringList.insert(tok);
    auto listIt = ctx.stringList.find(tok);
    Token::U u;
    u.s = listIt->c_str();
    tokens.push_back({ (TokenType)TK_STRING_LITERAL, false, false, (unsigned short)beginColumn, beginLine, u });
  }

  return true;
}